

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v3::load_child_refs(xr_ogf_v3 *this,xr_reader *r)

{
  uint32_t *puVar1;
  uint *puVar2;
  xr_file_system *this_00;
  xr_reader *pxVar3;
  xr_ogf_v3 *this_01;
  ulong uVar4;
  bool bVar5;
  string folder;
  string name;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if ((this->super_xr_ogf).m_children.
      super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->super_xr_ogf).m_children.
      super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_50.field_2._M_local_buf[0] = '\0';
    xr_file_system::split_path(&(this->super_xr_ogf).m_path,&local_90,(string *)0x0,(string *)0x0);
    this_00 = xr_file_system::instance();
    puVar2 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
    uVar4 = (ulong)*puVar2;
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      xr_reader::r_sz(r,&local_50);
      std::operator+(&local_70,&local_90,&local_50);
      pxVar3 = xr_file_system::r_open(this_00,local_70._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_70);
      if (pxVar3 != (xr_reader *)0x0) {
        this_01 = (xr_ogf_v3 *)operator_new(0x770);
        xr_ogf_v3(this_01);
        (*(this_01->super_xr_ogf).super_xr_object.super_xr_surface_factory._vptr_xr_surface_factory
          [0x15])(this_01,pxVar3);
        local_70._M_dataplus._M_p = (pointer)this_01;
        std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>::
        emplace_back<xray_re::xr_ogf*>
                  ((vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>> *)
                   &(this->super_xr_ogf).m_children,(xr_ogf **)&local_70);
        (*pxVar3->_vptr_xr_reader[1])(pxVar3);
      }
    }
    puVar1 = &(this->super_xr_ogf).m_loaded;
    *(byte *)puVar1 = (byte)*puVar1 | 0x20;
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    return;
  }
  __assert_fail("m_children.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                ,0x8f,"void xray_re::xr_ogf_v3::load_child_refs(xr_reader &)");
}

Assistant:

void xr_ogf_v3::load_child_refs(xr_reader& r)
{
	assert(m_children.empty());
	std::string folder, name;
	xr_file_system::split_path(m_path, &folder);
	xr_file_system& fs = xr_file_system::instance();
	for (uint_fast32_t n = r.r_u32(); n; --n) {
		r.r_sz(name);
		xr_reader* s = fs.r_open(folder + name);
		if (!s)
			continue;
		xr_ogf_v3* ogf = new xr_ogf_v3;
		ogf->load_ogf(*s);
		m_children.push_back(ogf);
		fs.r_close(s);
	}
	set_chunk_loaded(OGF3_CHILD_REFS);
}